

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int cholu(double *A,int N)

{
  int iVar1;
  double *U22;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)N;
  U22 = (double *)malloc(lVar4 * 8 * lVar4);
  iVar1 = rcholu(A,N,N,U22);
  uVar2 = 0;
  uVar5 = (ulong)(uint)N;
  if (N < 1) {
    uVar5 = 0;
  }
  for (; uVar2 != uVar5; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      A[uVar3] = 0.0;
    }
    A = A + lVar4;
  }
  free(U22);
  return iVar1;
}

Assistant:

int cholu(double *A, int N) {
	int stride,i,j,t,sc;
	double *U22;
	U22 = (double*) malloc(sizeof(double) * N * N);
	stride = N; 
	
	sc = rcholu(A,N,stride,U22);
	
	for(i=0; i < N;++i) {
		t = i *N;
		for(j=0;j < i;++j) {
			A[t+j] = 0.;
		}
	}

	free(U22);
	return sc;
	
}